

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void nng_system_logger(nng_log_level level,nng_log_facility facility,char *msgid,char *msg)

{
  uint local_24;
  int pri;
  char *msg_local;
  char *msgid_local;
  nng_log_facility facility_local;
  nng_log_level level_local;
  
  switch(level) {
  case NNG_LOG_ERR:
    local_24 = 3;
    break;
  case NNG_LOG_WARN:
    local_24 = 4;
    break;
  case NNG_LOG_NOTICE:
    local_24 = 5;
    break;
  case NNG_LOG_INFO:
    local_24 = 6;
    break;
  case NNG_LOG_DEBUG:
    local_24 = 7;
    break;
  default:
    local_24 = 6;
  }
  switch(facility) {
  case NNG_LOG_USER:
    local_24 = local_24 | 8;
    break;
  case NNG_LOG_DAEMON:
    local_24 = local_24 | 0x18;
    break;
  case NNG_LOG_AUTH:
    local_24 = local_24 | 0x50;
    break;
  case NNG_LOG_LOCAL0:
    local_24 = local_24 | 0x80;
    break;
  case NNG_LOG_LOCAL1:
    local_24 = local_24 | 0x88;
    break;
  case NNG_LOG_LOCAL2:
    local_24 = local_24 | 0x90;
    break;
  case NNG_LOG_LOCAL3:
    local_24 = local_24 | 0x98;
    break;
  case NNG_LOG_LOCAL4:
    local_24 = local_24 | 0xa0;
    break;
  case NNG_LOG_LOCAL5:
    local_24 = local_24 | 0xa8;
    break;
  case NNG_LOG_LOCAL6:
    local_24 = local_24 | 0xb0;
    break;
  case NNG_LOG_LOCAL7:
    local_24 = local_24 | 0xb8;
  }
  if (msgid == (char *)0x0) {
    syslog(local_24,"%s",msg);
  }
  else {
    syslog(local_24,"%s: %s",msgid,msg);
  }
  return;
}

Assistant:

void
nng_system_logger(nng_log_level level, nng_log_facility facility,
    const char *msgid, const char *msg)
{
#ifdef NNG_HAVE_SYSLOG
	int pri;
	switch (level) {
	case NNG_LOG_ERR:
		pri = LOG_ERR;
		break;
	case NNG_LOG_WARN:
		pri = LOG_WARNING;
		break;
	case NNG_LOG_NOTICE:
		pri = LOG_NOTICE;
		break;
	case NNG_LOG_INFO:
		pri = LOG_INFO;
		break;
	case NNG_LOG_DEBUG:
		pri = LOG_DEBUG;
		break;
	default:
		pri = LOG_INFO;
		break;
	}
	switch (facility) {
	case NNG_LOG_DAEMON:
		pri |= LOG_DAEMON;
		break;
	case NNG_LOG_USER:
		pri |= LOG_USER;
		break;
	case NNG_LOG_AUTH:
		pri |= LOG_AUTHPRIV;
		break;
	case NNG_LOG_LOCAL0:
		pri |= LOG_LOCAL0;
		break;
	case NNG_LOG_LOCAL1:
		pri |= LOG_LOCAL1;
		break;
	case NNG_LOG_LOCAL2:
		pri |= LOG_LOCAL2;
		break;
	case NNG_LOG_LOCAL3:
		pri |= LOG_LOCAL3;
		break;
	case NNG_LOG_LOCAL4:
		pri |= LOG_LOCAL4;
		break;
	case NNG_LOG_LOCAL5:
		pri |= LOG_LOCAL5;
		break;
	case NNG_LOG_LOCAL6:
		pri |= LOG_LOCAL6;
		break;
	case NNG_LOG_LOCAL7:
		pri |= LOG_LOCAL7;
		break;
	}

	if (msgid) {
		syslog(pri, "%s: %s", msgid, msg);
	} else {
		syslog(pri, "%s", msg);
	}
#else
	// everyone else just goes to stderr for now
	nng_stderr_logger(level, facility, msgid, msg);
#endif
}